

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O2

int __thiscall
MIDIStreamer::FillBuffer(MIDIStreamer *this,int buffer_num,int max_events,DWORD max_time)

{
  byte bVar1;
  EState EVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  DWORD (*paDVar6) [384];
  long lVar7;
  MIDIStreamer *this_00;
  DWORD (*paDVar8) [384];
  DWORD DVar9;
  
  this_00 = this;
  if ((this->Restarting == false) &&
     (iVar3 = (*(this->super_MusInfo)._vptr_MusInfo[0x19])(), (char)iVar3 != '\0')) {
    return 1;
  }
  paDVar8 = this->Events + buffer_num;
  paDVar6 = paDVar8;
  if (this->InitialPlayback == true) {
    this->InitialPlayback = false;
    (*paDVar8)[0] = 0;
    this->Events[buffer_num][1] = 0;
    this->Events[buffer_num][2] = 0x80000008;
    this->Events[buffer_num][3] = 0x47f7ff0;
    this->Events[buffer_num][4] = 0xf77f7f01;
    paDVar6 = (DWORD (*) [384])(this->Events[buffer_num] + 5);
    this_00 = this;
    (*(this->super_MusInfo)._vptr_MusInfo[0x17])();
  }
  EVar2 = (this->super_MusInfo).m_Status;
  if (this->VolumeChanged == true) {
    if ((EVar2 != STATE_Paused) || (this->NewVolume == 0)) {
      this->VolumeChanged = false;
      for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
        bVar1 = this->ChannelVolumes[lVar7];
        DVar9 = this->NewVolume;
        *(DWORD *)((long)paDVar6 + 0) = 0;
        *(DWORD *)((long)paDVar6 + 4) = 0;
        (*paDVar6)[2] = ((bVar1 + 1) * DVar9 & 0xff0000) + (int)lVar7 + 0x7b0;
        paDVar6 = (DWORD (*) [384])(*paDVar6 + 3);
      }
      goto LAB_0035b777;
    }
  }
  else {
LAB_0035b777:
    if (EVar2 != STATE_Paused) {
      if (this->Restarting == true) {
        this->Restarting = false;
        *(DWORD *)((long)paDVar6 + 0) = 0;
        *(DWORD *)((long)paDVar6 + 4) = 0;
        (*paDVar6)[2] = this->InitialTempo | 0x1000000;
        paDVar6 = (DWORD (*) [384])WriteStopNotes(this_00,*paDVar6 + 3);
        (*(this->super_MusInfo)._vptr_MusInfo[0x18])(this);
      }
      iVar3 = (*(this->super_MusInfo)._vptr_MusInfo[0x1c])
                        (this,paDVar6,this->Events[buffer_num] + (max_events * 3 + -3),
                         (ulong)max_time);
      goto LAB_0035b821;
    }
  }
  uVar4 = ((max_time / 3) * this->Division) / (uint)this->Tempo;
  (*paDVar6)[0] = uVar4 + (uVar4 == 0);
  *(DWORD *)((long)paDVar6 + 4) = 0;
  *(DWORD *)((long)paDVar6 + 8) = 0x2000000;
  iVar3 = (int)paDVar6 + 0xc;
LAB_0035b821:
  this->Buffer[buffer_num].lpNext = (MIDIHDR *)0x0;
  this->Buffer[buffer_num].lpData = (BYTE *)paDVar8;
  DVar9 = iVar3 - (int)paDVar8;
  this->Buffer[buffer_num].dwBufferLength = DVar9;
  this->Buffer[buffer_num].dwBytesRecorded = DVar9;
  iVar5 = (*this->MIDI->_vptr_MIDIDevice[0xc])();
  iVar3 = iVar5 * 4 + 2;
  if (iVar5 == 0) {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int MIDIStreamer::FillBuffer(int buffer_num, int max_events, DWORD max_time)
{
	if (!Restarting && CheckDone())
	{
		return SONG_DONE;
	}

	int i;
	DWORD *events = Events[buffer_num], *max_event_p;
	DWORD tot_time = 0;
	DWORD time = 0;

	// The final event is for a NOP to hold the delay from the last event.
	max_event_p = events + (max_events - 1) * 3;

	if (InitialPlayback)
	{
		InitialPlayback = false;
		// Send the full master volume SysEx message.
		events[0] = 0;								// dwDeltaTime
		events[1] = 0;								// dwStreamID
		events[2] = (MEVT_LONGMSG << 24) | 8;		// dwEvent
		events[3] = MAKE_ID(0xf0,0x7f,0x7f,0x04);	// dwParms[0]
		events[4] = MAKE_ID(0x01,0x7f,0x7f,0xf7);	// dwParms[1]
		events += 5;
		DoInitialSetup();
	}

	// If the volume has changed, stick those events at the start of this buffer.
	if (VolumeChanged && (m_Status != STATE_Paused || NewVolume == 0))
	{
		VolumeChanged = false;
		for (i = 0; i < 16; ++i)
		{
			BYTE courseVol = (BYTE)(((ChannelVolumes[i]+1) * NewVolume) >> 16);
			events[0] = 0;				// dwDeltaTime
			events[1] = 0;				// dwStreamID
			events[2] = MIDI_CTRLCHANGE | i | (7<<8) | (courseVol<<16);
			events += 3;
		}
	}

	// Play nothing while paused.
	if (m_Status == STATE_Paused)
	{
		// Be more responsive when unpausing by only playing each buffer
		// for a third of the maximum time.
		events[0] = MAX<DWORD>(1, (max_time / 3) * Division / Tempo);
		events[1] = 0;
		events[2] = MEVT_NOP << 24;
		events += 3;
	}
	else
	{
		if (Restarting)
		{
			Restarting = false;
			// Reset the tempo to the inital value.
			events[0] = 0;									// dwDeltaTime
			events[1] = 0;									// dwStreamID
			events[2] = (MEVT_TEMPO << 24) | InitialTempo;	// dwEvent
			events += 3;
			// Stop all notes in case any were left hanging.
			events = WriteStopNotes(events);
			DoRestart();
		}
		events = MakeEvents(events, max_event_p, max_time);
	}
	memset(&Buffer[buffer_num], 0, sizeof(MIDIHDR));
	Buffer[buffer_num].lpData = (LPSTR)Events[buffer_num];
	Buffer[buffer_num].dwBufferLength = DWORD((LPSTR)events - Buffer[buffer_num].lpData);
	Buffer[buffer_num].dwBytesRecorded = Buffer[buffer_num].dwBufferLength;
	if (0 != (i = MIDI->PrepareHeader(&Buffer[buffer_num])))
	{
		return SONG_ERROR | (i << 2);
	}
	return SONG_MORE;
}